

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O3

ze_result_t
tracing_layer::zeDriverGetExtensionFunctionAddress
          (ze_driver_handle_t hDriver,char *name,void **ppFunctionAddress)

{
  ulong uVar1;
  _func_void__ze_driver_get_extension_function_address_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var2;
  _func__ze_result_t__ze_driver_handle_t_ptr_char_ptr_void_ptr_ptr *zeApiPtr;
  _ze_result_t _Var3;
  ze_result_t zVar4;
  char *pcVar5;
  ulong *puVar6;
  long lVar7;
  ulong uVar8;
  void **ppFunctionAddress_local;
  char *name_local;
  ze_driver_handle_t hDriver_local;
  APITracerCallbackDataImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_98;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_80;
  APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_driver_get_extension_function_address_params_t tracerParams;
  
  if (DAT_001831f0 == (_func__ze_result_t__ze_driver_handle_t_ptr_char_ptr_void_ptr_ptr *)0x0) {
    zVar4 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    ppFunctionAddress_local = ppFunctionAddress;
    name_local = name;
    hDriver_local = hDriver;
    tracing_layer::tracingInProgress::__tls_init();
    pcVar5 = (char *)__tls_get_addr(&PTR_00182fa0);
    if (*pcVar5 != '\0') {
      _Var3 = (*DAT_001831f0)(hDriver,name,ppFunctionAddress);
      return _Var3;
    }
    tracing_layer::tracingInProgress::__tls_init();
    *pcVar5 = '\x01';
    tracerParams.phDriver = &hDriver_local;
    tracerParams.pname = &name_local;
    tracerParams.pppFunctionAddress = &ppFunctionAddress_local;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    apiCallbackData.apiOrdinal =
         (_func_void__ze_driver_get_extension_function_address_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
          *)0x0;
    apiCallbackData.prologCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    apiCallbackData.epilogCallbacks.
    super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    puVar6 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
    if ((puVar6 != (ulong *)0x0) && (*puVar6 != 0)) {
      lVar7 = 0xcb0;
      uVar8 = 0;
      do {
        uVar1 = puVar6[1];
        prologCallback.current_api_callback =
             *(_func_void__ze_driver_get_extension_function_address_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
               **)((uVar1 - 0xbf0) + lVar7);
        p_Var2 = *(_func_void__ze_driver_get_extension_function_address_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                   **)((uVar1 - 0x598) + lVar7);
        prologCallback.pUserData = *(void **)(uVar1 + lVar7);
        if (apiCallbackData.prologCallbacks.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            apiCallbackData.prologCallbacks.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>>>
                      *)&apiCallbackData.prologCallbacks,
                     (iterator)
                     apiCallbackData.prologCallbacks.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&prologCallback);
        }
        else {
          (apiCallbackData.prologCallbacks.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback =
               prologCallback.current_api_callback;
          (apiCallbackData.prologCallbacks.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = prologCallback.pUserData;
          apiCallbackData.prologCallbacks.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               apiCallbackData.prologCallbacks.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        epilogCallback.pUserData = *(void **)(puVar6[1] + lVar7);
        epilogCallback.current_api_callback = p_Var2;
        if (apiCallbackData.epilogCallbacks.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            apiCallbackData.epilogCallbacks.
            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>>>
          ::
          _M_realloc_insert<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>const&>
                    ((vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>>>
                      *)&apiCallbackData.epilogCallbacks,
                     (iterator)
                     apiCallbackData.epilogCallbacks.
                     super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&epilogCallback);
        }
        else {
          (apiCallbackData.epilogCallbacks.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->current_api_callback = p_Var2;
          (apiCallbackData.epilogCallbacks.
           super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->pUserData = epilogCallback.pUserData;
          apiCallbackData.epilogCallbacks.
          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               apiCallbackData.epilogCallbacks.
               super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0xcb8;
      } while (uVar8 < *puVar6);
    }
    p_Var2 = apiCallbackData.apiOrdinal;
    zeApiPtr = DAT_001831f0;
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_80,&apiCallbackData.prologCallbacks);
    std::
    vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
    ::vector(&local_98,&apiCallbackData.epilogCallbacks);
    zVar4 = APITracerWrapperImp<_ze_result_t(*)(_ze_driver_handle_t*,char_const*,void**),_ze_driver_get_extension_function_address_params_t*,void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_driver_get_extension_function_address_params_t*,_ze_result_t,void*,void**)>>>,_ze_driver_handle_t*&,char_const*&,void**&>
                      (zeApiPtr,&tracerParams,p_Var2,&local_80,&local_98,&hDriver_local,&name_local,
                       &ppFunctionAddress_local);
    if (local_98.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_80.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_80.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_80.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (apiCallbackData.epilogCallbacks.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(apiCallbackData.epilogCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)apiCallbackData.epilogCallbacks.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)apiCallbackData.epilogCallbacks.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (apiCallbackData.prologCallbacks.
        super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(apiCallbackData.prologCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)apiCallbackData.prologCallbacks.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)apiCallbackData.prologCallbacks.
                            super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_driver_get_extension_function_address_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return zVar4;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDriverGetExtensionFunctionAddress(
        ze_driver_handle_t hDriver,                     ///< [in] handle of the driver instance
        const char* name,                               ///< [in] extension function name
        void** ppFunctionAddress                        ///< [out] pointer to function pointer
        )
    {
        auto pfnGetExtensionFunctionAddress = context.zeDdiTable.Driver.pfnGetExtensionFunctionAddress;

        if( nullptr == pfnGetExtensionFunctionAddress)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.Driver.pfnGetExtensionFunctionAddress, hDriver, name, ppFunctionAddress);

        // capture parameters
        ze_driver_get_extension_function_address_params_t tracerParams = {
            &hDriver,
            &name,
            &ppFunctionAddress
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnDriverGetExtensionFunctionAddressCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnDriverGetExtensionFunctionAddressCb_t, Driver, pfnGetExtensionFunctionAddressCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.Driver.pfnGetExtensionFunctionAddress,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phDriver,
                                                  *tracerParams.pname,
                                                  *tracerParams.pppFunctionAddress);
    }